

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O3

Result wabt::interp::Match(Limits *expected,Limits *actual,string *out_msg)

{
  char *format;
  string local_30;
  
  if (actual->initial < expected->initial) {
    format = "actual size (%lu) smaller than declared (%lu)";
  }
  else {
    if (expected->has_max != true) {
      return (Result)Ok;
    }
    if (actual->has_max == false) {
      StringPrintf_abi_cxx11_
                (&local_30,"max size (unspecified) larger than declared (%lu)",expected->max);
      goto LAB_00122f05;
    }
    if (actual->max <= expected->max) {
      return (Result)Ok;
    }
    format = "max size (%lu) larger than declared (%lu)";
  }
  StringPrintf_abi_cxx11_(&local_30,format);
LAB_00122f05:
  std::__cxx11::string::operator=((string *)out_msg,(string *)&local_30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return (Result)Error;
}

Assistant:

Result Match(const Limits& expected,
             const Limits& actual,
             std::string* out_msg) {
  if (actual.initial < expected.initial) {
    *out_msg = StringPrintf("actual size (%" PRIu64
                            ") smaller than declared (%" PRIu64 ")",
                            actual.initial, expected.initial);
    return Result::Error;
  }

  if (expected.has_max) {
    if (!actual.has_max) {
      *out_msg = StringPrintf(
          "max size (unspecified) larger than declared (%" PRIu64 ")",
          expected.max);
      return Result::Error;
    } else if (actual.max > expected.max) {
      *out_msg = StringPrintf("max size (%" PRIu64
                              ") larger than declared (%" PRIu64 ")",
                              actual.max, expected.max);
      return Result::Error;
    }
  }

  return Result::Ok;
}